

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O0

void luaK_infix(FuncState *fs,BinOpr op,expdesc *v)

{
  int iVar1;
  expdesc *v_local;
  BinOpr op_local;
  FuncState *fs_local;
  
  switch(op) {
  case OPR_ADD:
  case OPR_SUB:
  case OPR_MUL:
  case OPR_MOD:
  case OPR_POW:
  case OPR_DIV:
  case OPR_IDIV:
  case OPR_BAND:
  case OPR_BOR:
  case OPR_BXOR:
  case OPR_SHL:
  case OPR_SHR:
    iVar1 = tonumeral(v,(TValue *)0x0);
    if (iVar1 == 0) {
      luaK_exp2RK(fs,v);
    }
    break;
  case OPR_CONCAT:
    luaK_exp2nextreg(fs,v);
    break;
  default:
    luaK_exp2RK(fs,v);
    break;
  case OPR_AND:
    luaK_goiftrue(fs,v);
    break;
  case OPR_OR:
    luaK_goiffalse(fs,v);
  }
  return;
}

Assistant:

void luaK_infix(FuncState *fs, BinOpr op, expdesc *v) {
    switch (op) {
        case OPR_AND: {
            luaK_goiftrue(fs, v);  /* go ahead only if 'v' is true */
            break;
        }
        case OPR_OR: {
            luaK_goiffalse(fs, v);  /* go ahead only if 'v' is false */
            break;
        }
        case OPR_CONCAT: {
            luaK_exp2nextreg(fs, v);  /* operand must be on the 'stack' */
            break;
        }
        case OPR_ADD:
        case OPR_SUB:
        case OPR_MUL:
        case OPR_DIV:
        case OPR_IDIV:
        case OPR_MOD:
        case OPR_POW:
        case OPR_BAND:
        case OPR_BOR:
        case OPR_BXOR:
        case OPR_SHL:
        case OPR_SHR: {
            if (!tonumeral(v, NULL))
                luaK_exp2RK(fs, v);
            /* else keep numeral, which may be folded with 2nd operand */
            break;
        }
        default: {
            luaK_exp2RK(fs, v);
            break;
        }
    }
}